

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,ft::allocator<int>>::assign<ft::constListIterator<int>>
          (list<int,ft::allocator<int>> *this,constListIterator<int> *first,
          constListIterator<int> *last,type *param_3)

{
  bool bVar1;
  const_reference val;
  type *param_3_local;
  constListIterator<int> *last_local;
  constListIterator<int> *first_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  list<int,_ft::allocator<int>_>::clear((list<int,_ft::allocator<int>_> *)this);
  while( true ) {
    bVar1 = operator!=(&first->super_listIterator<int>,&last->super_listIterator<int>);
    if (!bVar1) break;
    val = constListIterator<int>::operator*(first);
    list<int,_ft::allocator<int>_>::push_back((list<int,_ft::allocator<int>_> *)this,val);
    listIterator<int>::operator++(&first->super_listIterator<int>);
  }
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();
		while (first != last) {
			this->push_back(*first);
			++first;
		}
	}